

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffbnfmll(char *tform,int *dtcode,LONGLONG *trepeat,long *twidth,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  char *err_message;
  byte *pbVar8;
  byte bVar9;
  size_t sVar10;
  long width;
  long lStack_f0;
  double drepeat;
  char message [81];
  char temp [71];
  
  if (0 < *status) {
    return *status;
  }
  if (dtcode != (int *)0x0) {
    *dtcode = 0;
  }
  if (trepeat != (LONGLONG *)0x0) {
    *trepeat = 0;
  }
  if (twidth != (long *)0x0) {
    *twidth = 0;
  }
  sVar2 = strlen(tform);
  sVar10 = 0;
LAB_001333b3:
  if (sVar2 != sVar10) {
    if (tform[sVar10] == ' ') goto code_r0x001333c0;
    if (sVar2 != sVar10) {
      sVar2 = strlen(tform + sVar10);
      if (sVar2 < 0x47) {
        strcpy(temp,tform + sVar10);
        ffupch(temp);
        ppuVar3 = __ctype_b_loc();
        lVar4 = 1;
        pbVar7 = (byte *)temp;
        do {
          pbVar5 = pbVar7;
          bVar9 = *pbVar5;
          pbVar7 = pbVar5 + 1;
          lVar4 = lVar4 + -1;
        } while ((*(byte *)((long)*ppuVar3 + (long)(char)bVar9 * 2 + 1) & 8) != 0);
        if (lVar4 == 0) {
          lVar4 = 1;
        }
        else {
          __isoc99_sscanf(temp,"%lf",&drepeat);
          lVar4 = (long)(drepeat + 0.1);
          bVar9 = *pbVar5;
        }
        bVar9 = bVar9 & 0xfe;
        pbVar8 = pbVar5;
        if (bVar9 == 0x50) {
          pbVar8 = pbVar7;
        }
        lStack_f0 = 2;
        switch(*pbVar8) {
        case 0x41:
          pbVar5 = pbVar5 + 2;
          if (bVar9 != 0x50) {
            pbVar5 = pbVar7;
          }
          iVar6 = 0x10;
          if (*pbVar5 != 0) {
            if (*pbVar5 == 0x28) {
              pbVar8 = pbVar5;
            }
            iVar1 = __isoc99_sscanf(pbVar8 + 1,"%ld",message);
            if ((iVar1 == 1) &&
               ((lStack_f0 = message._0_8_, bVar9 == 0x50 || ((long)message._0_8_ <= lVar4))))
            break;
          }
          lStack_f0 = lVar4;
          break;
        case 0x42:
          iVar6 = 0xb;
          goto LAB_00133589;
        case 0x43:
          iVar6 = 0x53;
          goto LAB_00133572;
        case 0x44:
          iVar6 = 0x52;
          goto LAB_00133572;
        case 0x45:
          iVar6 = 0x2a;
          goto LAB_00133579;
        default:
          snprintf(message,0x51,"Illegal binary table TFORMn datatype: \'%s\' ",tform);
          ffpmsg(message);
          *status = 0x106;
          return 0x106;
        case 0x49:
          iVar6 = 0x15;
          break;
        case 0x4a:
          iVar6 = 0x29;
          goto LAB_00133579;
        case 0x4b:
          iVar6 = 0x51;
          goto LAB_00133572;
        case 0x4c:
          iVar6 = 0xe;
          goto LAB_00133589;
        case 0x4d:
          iVar6 = 0xa3;
          lStack_f0 = 0x10;
          break;
        case 0x53:
          iVar6 = 0xc;
          goto LAB_00133589;
        case 0x55:
          iVar6 = 0x14;
          break;
        case 0x56:
          iVar6 = 0x28;
LAB_00133579:
          lStack_f0 = 4;
          break;
        case 0x57:
          iVar6 = 0x50;
LAB_00133572:
          lStack_f0 = 8;
          break;
        case 0x58:
          iVar6 = 1;
LAB_00133589:
          lStack_f0 = 1;
        }
        if (dtcode != (int *)0x0) {
          iVar1 = -iVar6;
          if (bVar9 != 0x50) {
            iVar1 = iVar6;
          }
          *dtcode = iVar1;
        }
        if (trepeat != (LONGLONG *)0x0) {
          *trepeat = lVar4;
        }
        if (twidth != (long *)0x0) {
          *twidth = lStack_f0;
        }
        return *status;
      }
      err_message = "Error: binary table TFORM code is too long (ffbnfmll).";
      goto LAB_001333d1;
    }
  }
  err_message = "Error: binary table TFORM code is blank (ffbnfmll).";
LAB_001333d1:
  ffpmsg(err_message);
  *status = 0x105;
  return 0x105;
code_r0x001333c0:
  sVar10 = sVar10 + 1;
  goto LAB_001333b3;
}

Assistant:

int ffbnfmll(char *tform,     /* I - format code from the TFORMn keyword */
           int *dtcode,   /* O - numerical datatype code */
           LONGLONG *trepeat,    /* O - repeat count of the field  */
           long *twidth,     /* O - width of the field, in chars */
           int *status)     /* IO - error status      */
{
/*
  parse the binary table TFORM column format to determine the data
  type, repeat count, and the field width (if it is an ASCII (A) field)
*/
    size_t ii, nchar;
    int datacode, variable, iread;
    long width;
    LONGLONG repeat;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];
    double drepeat;

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (trepeat)
        *trepeat = 0;

    if (twidth)
        *twidth = 0;

    nchar = strlen(tform);

    for (ii = 0; ii < nchar; ii++)
    {
        if (tform[ii] != ' ')     /* find first non-space char */
            break;
    }

    if (ii == nchar)
    {
        ffpmsg("Error: binary table TFORM code is blank (ffbnfmll).");
        return(*status = BAD_TFORM);
    }
    
    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: binary table TFORM code is too long (ffbnfmll).");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */

    /*-----------------------------------------------*/
    /*       get the repeat count                    */
    /*-----------------------------------------------*/

    ii = 0;
    while(isdigit((int) form[ii]))
        ii++;   /* look for leading digits in the field */

    if (ii == 0)
        repeat = 1;  /* no explicit repeat count */
    else {
       /* read repeat count */

        /* print as double, because the string-to-64-bit int conversion */
        /* character is platform dependent (%lld, %ld, %I64d)           */

        sscanf(form,"%lf", &drepeat);
        repeat = (LONGLONG) (drepeat + 0.1);
    }
    /*-----------------------------------------------*/
    /*             determine datatype code           */
    /*-----------------------------------------------*/

    form = form + ii;  /* skip over the repeat field */

    if (form[0] == 'P' || form[0] == 'Q')
    {
        variable = 1;  /* this is a variable length column */
/*        repeat = 1;  */  /* disregard any other repeat value */
        form++;        /* move to the next data type code char */
    }
    else
        variable = 0;

    if (form[0] == 'U')  /* internal code to signify unsigned integer */
    { 
        datacode = TUSHORT;
        width = 2;
    }
    else if (form[0] == 'I')
    {
        datacode = TSHORT;
        width = 2;
    }
    else if (form[0] == 'V') /* internal code to signify unsigned integer */
    {
        datacode = TULONG;
        width = 4;
    }
    else if (form[0] == 'W') /* internal code to signify unsigned long long integer */
    {
        datacode = TULONGLONG;
        width = 8;
    }
    else if (form[0] == 'J')
    {
        datacode = TLONG;
        width = 4;
    }
    else if (form[0] == 'K')
    {
        datacode = TLONGLONG;
        width = 8;
    }
    else if (form[0] == 'E')
    {
        datacode = TFLOAT;
        width = 4;
    }
    else if (form[0] == 'D')
    {
        datacode = TDOUBLE;
        width = 8;
    }
    else if (form[0] == 'A')
    {
        datacode = TSTRING;

        /*
          the following code is used to support the non-standard
          datatype of the form rAw where r = total width of the field
          and w = width of fixed-length substrings within the field.
        */
        iread = 0;
        if (form[1] != 0)
        {
            if (form[1] == '(' )  /* skip parenthesis around */
                form++;          /* variable length column width */

            iread = sscanf(&form[1],"%ld", &width);
        }

        if (iread != 1 || (!variable && (width > repeat)) )
            width = (long) repeat;
  
    }
    else if (form[0] == 'L')
    {
        datacode = TLOGICAL;
        width = 1;
    }
    else if (form[0] == 'X')
    {
        datacode = TBIT;
        width = 1;
    }
    else if (form[0] == 'B')
    {
        datacode = TBYTE;
        width = 1;
    }
    else if (form[0] == 'S') /* internal code to signify signed byte */
    {
        datacode = TSBYTE;
        width = 1;
    }
    else if (form[0] == 'C')
    {
        datacode = TCOMPLEX;
        width = 8;
    }
    else if (form[0] == 'M')
    {
        datacode = TDBLCOMPLEX;
        width = 16;
    }
    else
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal binary table TFORMn datatype: \'%s\' ", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (variable)
        datacode = datacode * (-1); /* flag variable cols w/ neg type code */

    if (dtcode)
       *dtcode = datacode;

    if (trepeat)
       *trepeat = repeat;

    if (twidth)
       *twidth = width;

    return(*status);
}